

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O0

int __thiscall KParser::_var(KParser *this,int begin,BlockInfo *bi)

{
  reference pvVar1;
  allocator local_299;
  string local_298 [32];
  char local_278 [8];
  char buf_1 [256];
  allocator local_159;
  string local_158 [32];
  char local_138 [8];
  char buf [256];
  int t;
  int i;
  BlockInfo *bi_local;
  int begin_local;
  KParser *this_local;
  
  pvVar1 = std::vector<Token,_std::allocator<Token>_>::operator[](&this->m_tokens,(long)begin);
  if (pvVar1->tokenType == _var) {
    pvVar1 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (&this->m_tokens,(long)(begin + 1));
    if (pvVar1->tokenType == id) {
      pvVar1 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (&this->m_tokens,(long)(begin + 2));
      if (pvVar1->tokenType == semicolon) {
        this_local._4_4_ = begin + 3;
      }
      else {
        pvVar1 = std::vector<Token,_std::allocator<Token>_>::operator[]
                           (&this->m_tokens,(long)(begin + 2));
        sprintf(local_278,anon_var_dwarf_f102,(ulong)(uint)pvVar1->line);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_298,local_278,&local_299);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->m_errorMsgs,(value_type *)local_298);
        std::__cxx11::string::~string(local_298);
        std::allocator<char>::~allocator((allocator<char> *)&local_299);
        this_local._4_4_ = -1;
      }
    }
    else {
      pvVar1 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (&this->m_tokens,(long)(begin + 1));
      sprintf(local_138,anon_var_dwarf_f0ec,(ulong)(uint)pvVar1->line);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,local_138,&local_159);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_errorMsgs,(value_type *)local_158);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int KParser::_var(int begin,  BlockInfo bi) {
    int i = begin;
    int t = 0;

    if (m_tokens[i].tokenType != TokenType::_var) {
        return -1;
    }
    i++;

    if (m_tokens[i].tokenType != TokenType::id) {
        char buf[256];
        sprintf(buf, "line[%d]: 식별자가 빠졌습니다.\n", m_tokens[i].line);
        m_errorMsgs.push_back(buf);
        return -1;
    }
    i++;

    if (m_tokens[i].tokenType != TokenType::semicolon) {
        char buf[256];
        sprintf(buf, "line[%d]: ; 가 빠졌습니다.\n", m_tokens[i].line);
        m_errorMsgs.push_back(buf);
        return -1;
    }
    i++;
    return i;
}